

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSwitch.c
# Opt level: O1

float Map_MappingGetSwitching(Map_Man_t *pMan)

{
  Map_Node_t *p;
  int iVar1;
  Map_NodeVec_t *pMVar2;
  long lVar3;
  float local_1c;
  
  pMVar2 = pMan->vMapObjs;
  if (pMVar2->nSize < 1) {
    local_1c = 0.0;
  }
  else {
    local_1c = 0.0;
    lVar3 = 0;
    do {
      p = pMVar2->pArray[lVar3];
      if (p->nRefAct[2] != 0) {
        if ((p->pCutBest[0] == (Map_Cut_t *)0x0) && (p->pCutBest[1] == (Map_Cut_t *)0x0)) {
          __assert_fail("pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSwitch.c"
                        ,0xc6,"float Map_MappingGetSwitching(Map_Man_t *)");
        }
        if ((p->nRefAct[0] < 1) && (p->nRefAct[1] < 1)) {
          __assert_fail("pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSwitch.c"
                        ,200,"float Map_MappingGetSwitching(Map_Man_t *)");
        }
        iVar1 = Map_NodeIsAnd(p);
        if (iVar1 != 0) {
          if ((p->pCutBest[0] != (Map_Cut_t *)0x0) &&
             ((0 < p->nRefAct[0] || (p->pCutBest[1] == (Map_Cut_t *)0x0)))) {
            local_1c = local_1c + p->Switching;
          }
          if ((p->pCutBest[1] != (Map_Cut_t *)0x0) &&
             ((p->pCutBest[0] == (Map_Cut_t *)0x0 || (0 < p->nRefAct[1])))) {
            local_1c = local_1c + p->Switching;
          }
        }
        if (((p->pCutBest[0] == (Map_Cut_t *)0x0) && (0 < p->nRefAct[0])) ||
           ((p->pCutBest[1] == (Map_Cut_t *)0x0 && (0 < p->nRefAct[1])))) {
          local_1c = local_1c + p->Switching;
        }
      }
      lVar3 = lVar3 + 1;
      pMVar2 = pMan->vMapObjs;
    } while (lVar3 < pMVar2->nSize);
  }
  if (0 < pMan->nOutputs) {
    lVar3 = 0;
    do {
      iVar1 = Map_NodeIsVar(pMan->pOutputs[lVar3]);
      if ((iVar1 != 0) && (((ulong)pMan->pOutputs[lVar3] & 1) == 0)) {
        local_1c = local_1c + pMan->pOutputs[lVar3]->Switching;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pMan->nOutputs);
  }
  return local_1c;
}

Assistant:

float Map_MappingGetSwitching( Map_Man_t * pMan )
{
    Map_Node_t * pNode;
    float Switch = 0.0;
    int i;
    for ( i = 0; i < pMan->vMapObjs->nSize; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        if ( pNode->nRefAct[2] == 0 )
            continue;
        // at least one phase has the best cut assigned
        assert( pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL );
        // at least one phase is used in the mapping
        assert( pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0 );
        // compute the array due to the supergate
        if ( Map_NodeIsAnd(pNode) )
        {
            // count switching of the negative phase
            if ( pNode->pCutBest[0] && (pNode->nRefAct[0] > 0 || pNode->pCutBest[1] == NULL) )
                Switch += pNode->Switching;
            // count switching of the positive phase
            if ( pNode->pCutBest[1] && (pNode->nRefAct[1] > 0 || pNode->pCutBest[0] == NULL) )
                Switch += pNode->Switching;
        }
        // count switching of the interver if we need to implement one phase with another phase
        if ( (pNode->pCutBest[0] == NULL && pNode->nRefAct[0] > 0) || 
             (pNode->pCutBest[1] == NULL && pNode->nRefAct[1] > 0) )
            Switch += pNode->Switching; // inverter switches the same as the node
    }
    // add buffers for each CO driven by a CI
    for ( i = 0; i < pMan->nOutputs; i++ )
        if ( Map_NodeIsVar(pMan->pOutputs[i]) && !Map_IsComplement(pMan->pOutputs[i]) )
            Switch += pMan->pOutputs[i]->Switching;
    return Switch;
}